

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.h
# Opt level: O3

void __thiscall EventLoop::assertInLoopThread(EventLoop *this)

{
  int iVar1;
  int iVar2;
  int *in_FS_OFFSET;
  
  iVar1 = this->threadId_;
  iVar2 = *in_FS_OFFSET;
  if (iVar2 == 0) {
    CurrentThread::cacheTid();
    iVar2 = *in_FS_OFFSET;
  }
  if (iVar1 == iVar2) {
    return;
  }
  __assert_fail("isInLoopThread()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EventLoop.h"
                ,0x1a,"void EventLoop::assertInLoopThread()");
}

Assistant:

void assertInLoopThread() { assert(isInLoopThread()); }